

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O3

int fe_parse_general_params(cmd_ln_t *config,fe_t *fe)

{
  uint8 uVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  double dVar9;
  
  fe->config = config;
  dVar9 = cmd_ln_float_r(config,"-samprate");
  fe->sampling_rate = (float32)(float)dVar9;
  uVar5 = cmd_ln_int_r(config,"-frate");
  iVar3 = (int)uVar5;
  if (((0x7fff < iVar3) || (iVar3 < 1)) || ((float)fe->sampling_rate < (float)iVar3)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
            ,0x4a,"Frame rate %d can not be bigger than sample rate %.02f\n",
            (double)(float)fe->sampling_rate,uVar5 & 0xffffffff);
  }
  else {
    fe->frame_rate = (int16)uVar5;
    lVar6 = cmd_ln_int_r(config,"-dither");
    if (lVar6 != 0) {
      fe->dither = '\x01';
      lVar6 = cmd_ln_int_r(config,"-seed");
      fe->dither_seed = (int32)lVar6;
    }
    pcVar7 = cmd_ln_str_r(config,"-input_endian");
    iVar3 = strcmp("little",pcVar7);
    fe->swap = iVar3 != 0;
    dVar9 = cmd_ln_float_r(config,"-wlen");
    fe->window_length = (float32)(float)dVar9;
    dVar9 = cmd_ln_float_r(config,"-alpha");
    fe->pre_emphasis_alpha = (float32)(float)dVar9;
    lVar6 = cmd_ln_int_r(config,"-ncep");
    fe->num_cepstra = (uint8)lVar6;
    lVar6 = cmd_ln_int_r(config,"-nfft");
    sVar2 = (short)lVar6;
    fe->fft_size = sVar2;
    uVar5 = (ulong)(uint)(int)sVar2;
    if (sVar2 < 2) {
      uVar1 = '\0';
    }
    else {
      uVar1 = '\0';
      uVar8 = uVar5;
      do {
        if ((uVar8 & 1) != 0) {
          fe->fft_order = uVar1;
          pcVar7 = "fft: number of points must be a power of 2 (is %d)\n";
          lVar6 = 0x62;
          goto LAB_0010e0cb;
        }
        uVar4 = (uint)uVar8;
        uVar8 = uVar8 >> 1;
        uVar1 = uVar1 + '\x01';
      } while (2 < uVar4);
    }
    fe->fft_order = uVar1;
    uVar4 = (uint)((float)fe->window_length * (float)fe->sampling_rate);
    if ((int)uVar4 <= (int)sVar2) {
      lVar6 = cmd_ln_int_r(config,"-vad_prespeech");
      fe->pre_speech = (int16)lVar6;
      lVar6 = cmd_ln_int_r(config,"-vad_postspeech");
      fe->post_speech = (int16)lVar6;
      lVar6 = cmd_ln_int_r(config,"-vad_startspeech");
      fe->start_speech = (int16)lVar6;
      dVar9 = cmd_ln_float_r(config,"-vad_threshold");
      fe->vad_threshold = (float32)(float)dVar9;
      lVar6 = cmd_ln_int_r(config,"-remove_dc");
      fe->remove_dc = lVar6 != 0;
      lVar6 = cmd_ln_int_r(config,"-remove_noise");
      fe->remove_noise = lVar6 != 0;
      lVar6 = cmd_ln_int_r(config,"-remove_silence");
      fe->remove_silence = lVar6 != 0;
      pcVar7 = cmd_ln_str_r(config,"-transform");
      iVar3 = strcmp(pcVar7,"dct");
      if (iVar3 == 0) {
        uVar1 = '\x01';
      }
      else {
        pcVar7 = cmd_ln_str_r(config,"-transform");
        iVar3 = strcmp(pcVar7,"legacy");
        if (iVar3 == 0) {
          uVar1 = '\0';
        }
        else {
          pcVar7 = cmd_ln_str_r(config,"-transform");
          iVar3 = strcmp(pcVar7,"htk");
          if (iVar3 != 0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                    ,0x7d,"Invalid transform type (values are \'dct\', \'legacy\', \'htk\')\n");
            return -1;
          }
          uVar1 = '\x02';
        }
      }
      fe->transform = uVar1;
      lVar6 = cmd_ln_int_r(config,"-logspec");
      if (lVar6 != 0) {
        fe->log_spec = '\x01';
      }
      lVar6 = cmd_ln_int_r(config,"-smoothspec");
      if (lVar6 != 0) {
        fe->log_spec = '\x02';
        return 0;
      }
      return 0;
    }
    pcVar7 = "FFT: Number of points must be greater or equal to frame size (%d samples)\n";
    lVar6 = 0x69;
    uVar5 = (ulong)uVar4;
LAB_0010e0cb:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
            ,lVar6,pcVar7,uVar5);
  }
  return -1;
}

Assistant:

int
fe_parse_general_params(cmd_ln_t *config, fe_t * fe)
{
    int j, frate;

    fe->config = config;
    fe->sampling_rate = cmd_ln_float32_r(config, "-samprate");
    frate = cmd_ln_int32_r(config, "-frate");
    if (frate > MAX_INT16 || frate > fe->sampling_rate || frate < 1) {
        E_ERROR
            ("Frame rate %d can not be bigger than sample rate %.02f\n",
             frate, fe->sampling_rate);
        return -1;
    }

    fe->frame_rate = (int16)frate;
    if (cmd_ln_boolean_r(config, "-dither")) {
        fe->dither = 1;
        fe->dither_seed = cmd_ln_int32_r(config, "-seed");
    }
#ifdef WORDS_BIGENDIAN
    fe->swap = strcmp("big", cmd_ln_str_r(config, "-input_endian")) == 0 ? 0 : 1;
#else        
    fe->swap = strcmp("little", cmd_ln_str_r(config, "-input_endian")) == 0 ? 0 : 1;
#endif
    fe->window_length = cmd_ln_float32_r(config, "-wlen");
    fe->pre_emphasis_alpha = cmd_ln_float32_r(config, "-alpha");

    fe->num_cepstra = (uint8)cmd_ln_int32_r(config, "-ncep");
    fe->fft_size = (int16)cmd_ln_int32_r(config, "-nfft");

    /* Check FFT size, compute FFT order (log_2(n)) */
    for (j = fe->fft_size, fe->fft_order = 0; j > 1; j >>= 1, fe->fft_order++) {
        if (((j % 2) != 0) || (fe->fft_size <= 0)) {
            E_ERROR("fft: number of points must be a power of 2 (is %d)\n",
                    fe->fft_size);
            return -1;
        }
    }
    /* Verify that FFT size is greater or equal to window length. */
    if (fe->fft_size < (int)(fe->window_length * fe->sampling_rate)) {
        E_ERROR("FFT: Number of points must be greater or equal to frame size (%d samples)\n",
                (int)(fe->window_length * fe->sampling_rate));
        return -1;
    }

    fe->pre_speech = (int16)cmd_ln_int32_r(config, "-vad_prespeech");
    fe->post_speech = (int16)cmd_ln_int32_r(config, "-vad_postspeech");
    fe->start_speech = (int16)cmd_ln_int32_r(config, "-vad_startspeech");
    fe->vad_threshold = cmd_ln_float32_r(config, "-vad_threshold");

    fe->remove_dc = cmd_ln_boolean_r(config, "-remove_dc");
    fe->remove_noise = cmd_ln_boolean_r(config, "-remove_noise");
    fe->remove_silence = cmd_ln_boolean_r(config, "-remove_silence");

    if (0 == strcmp(cmd_ln_str_r(config, "-transform"), "dct"))
        fe->transform = DCT_II;
    else if (0 == strcmp(cmd_ln_str_r(config, "-transform"), "legacy"))
        fe->transform = LEGACY_DCT;
    else if (0 == strcmp(cmd_ln_str_r(config, "-transform"), "htk"))
        fe->transform = DCT_HTK;
    else {
        E_ERROR("Invalid transform type (values are 'dct', 'legacy', 'htk')\n");
        return -1;
    }

    if (cmd_ln_boolean_r(config, "-logspec"))
        fe->log_spec = RAW_LOG_SPEC;
    if (cmd_ln_boolean_r(config, "-smoothspec"))
        fe->log_spec = SMOOTH_LOG_SPEC;

    return 0;
}